

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

bool __thiscall LowererMD::GenerateFastNeg(LowererMD *this,Instr *instrNeg)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int32 iVar7;
  undefined4 *puVar8;
  RegOpnd *dstOpnd;
  AddrOpnd *this_00;
  LabelInstr *labelHelper;
  Opnd *pOVar9;
  Instr *pIVar10;
  BranchInstr *pBVar11;
  LabelInstr *branchTarget;
  
  pOVar9 = instrNeg->m_src1;
  if (pOVar9 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xe09,"(opndSrc1)","Expected src opnd on Neg instruction");
    if (!bVar2) goto LAB_00656bf2;
    *puVar8 = 0;
  }
  bVar2 = IR::Opnd::IsEqual(pOVar9,instrNeg->m_dst);
  if (bVar2) {
    dstOpnd = IR::RegOpnd::New(TyInt32,this->m_func);
  }
  else {
    dstOpnd = (RegOpnd *)IR::Opnd::UseWithNewType(instrNeg->m_dst,TyInt32,this->m_func);
  }
  OVar3 = IR::Opnd::GetKind(pOVar9);
  if (OVar3 == OpndKindReg) {
    OVar3 = IR::Opnd::GetKind(pOVar9);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_00656bf2;
      *puVar8 = 0;
    }
    bVar4 = StackSym::IsIntConst((StackSym *)pOVar9[1]._vptr_Opnd);
    if (bVar4) {
      OVar3 = IR::Opnd::GetKind(pOVar9);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) goto LAB_00656bf2;
        *puVar8 = 0;
      }
      iVar7 = StackSym::GetIntConstValue((StackSym *)pOVar9[1]._vptr_Opnd);
      if (iVar7 == 0) {
        this_00 = (AddrOpnd *)
                  Lowerer::LoadLibraryValueOpnd(this->m_lowerer,instrNeg,ValueNegativeZero);
      }
      else {
        this_00 = IR::AddrOpnd::NewFromNumber(-(long)iVar7,this->m_func,false);
      }
      IR::Instr::ClearBailOutInfo(instrNeg);
      IR::Instr::FreeSrc1(instrNeg);
      if (instrNeg->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar2) goto LAB_00656bf2;
        *puVar8 = 0;
      }
      func = instrNeg->m_func;
      if ((this_00->super_Opnd).isDeleted != true) {
LAB_00656bb2:
        bVar6 = (this_00->super_Opnd).field_0xb;
        if ((bVar6 & 2) != 0) {
          this_00 = (AddrOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,func);
          bVar6 = (this_00->super_Opnd).field_0xb;
        }
        (this_00->super_Opnd).field_0xb = bVar6 | 2;
        instrNeg->m_src1 = &this_00->super_Opnd;
        ChangeToWriteBarrierAssign(instrNeg,instrNeg->m_func);
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (bVar2) {
        *puVar8 = 0;
        goto LAB_00656bb2;
      }
      goto LAB_00656bf2;
    }
  }
  bVar4 = IR::Opnd::IsTaggedInt(pOVar9);
  OVar3 = IR::Opnd::GetKind(pOVar9);
  if (OVar3 == OpndKindReg) {
    OVar3 = IR::Opnd::GetKind(pOVar9);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_00656bf2;
      *puVar8 = 0;
    }
    bVar5 = IR::Opnd::IsNotInt(pOVar9);
    if (bVar5) {
      return true;
    }
  }
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  if (!bVar4) {
    GenerateSmIntTest(this,pOVar9,instrNeg,labelHelper,(Instr **)0x0,false);
  }
  pOVar9 = IR::Opnd::UseWithNewType(pOVar9,TyInt32,this->m_func);
  GenerateTaggedZeroTest(this,pOVar9,instrNeg,labelHelper);
  pIVar10 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,pOVar9,this->m_func);
  IR::Instr::InsertBefore(instrNeg,pIVar10);
  pIVar10 = IR::Instr::New(NEG,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrNeg,pIVar10);
  pBVar11 = IR::BranchInstr::New(JO,labelHelper,this->m_func);
  IR::Instr::InsertBefore(instrNeg,&pBVar11->super_Instr);
  if ((dstOpnd->super_Opnd).m_type != TyInt64) {
    dstOpnd = (RegOpnd *)IR::Opnd::UseWithNewType(&dstOpnd->super_Opnd,TyUint64,this->m_func);
  }
  GenerateInt32ToVarConversion(this,&dstOpnd->super_Opnd,instrNeg);
  if (bVar2) {
    pIVar10 = IR::Instr::New(MOV,instrNeg->m_dst,&dstOpnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instrNeg,pIVar10);
  }
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  pBVar11 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instrNeg,&pBVar11->super_Instr);
  if (labelHelper == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xe73,"(labelHelper)","Should not be NULL");
    if (!bVar2) {
LAB_00656bf2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  IR::Instr::InsertBefore(instrNeg,&labelHelper->super_Instr);
  IR::Instr::InsertAfter(instrNeg,&branchTarget->super_Instr);
  return true;
}

Assistant:

bool
LowererMD::GenerateFastNeg(IR::Instr * instrNeg)
{
    // Given:
    //
    // dst = Not src
    //
    // Generate:
    //
    //       if not int, jump $helper
    //       if src == 0    -- test for zero (must be handled by the runtime to preserve
    //       JEQ $helper          difference btw +0 and -0)
    // dst = MOV src
    // dst = NEG dst        -- do an inline NEG
    // dst = ADD dst, 2     -- restore the var tag on the result             [int31 only]
    //       JO $helper
    // dst = OR dst, AtomTag_Ptr                                             [int32 only]
    //       JMP $fallthru
    // $helper:
    //      (caller generates helper call)
    // $fallthru:

    IR::Instr *      instr;
    IR::LabelInstr * labelHelper = nullptr;
    IR::LabelInstr * labelFallThru = nullptr;
    IR::Opnd *       opndSrc1;
    IR::Opnd *       opndDst;
    bool usingNewDst = false;
    opndSrc1 = instrNeg->GetSrc1();
    AssertMsg(opndSrc1, "Expected src opnd on Neg instruction");

    if(opndSrc1->IsEqual(instrNeg->GetDst()))
    {
        usingNewDst = true;
        opndDst = IR::RegOpnd::New(TyInt32, this->m_func);
    }
    else
    {
        opndDst = instrNeg->GetDst()->UseWithNewType(TyInt32, this->m_func);
    }

    if (opndSrc1->IsRegOpnd() && opndSrc1->AsRegOpnd()->m_sym->IsIntConst())
    {
        IR::Opnd *newOpnd;
        IntConstType value = opndSrc1->AsRegOpnd()->m_sym->GetIntConstValue();

        if (value == 0)
        {
            // If the negate operand is zero, the result is -0.0, which is a Number rather than an Int31.
            newOpnd = m_lowerer->LoadLibraryValueOpnd(instrNeg, LibraryValue::ValueNegativeZero);
        }
        else
        {
            // negation below can overflow because max negative int32 value > max positive value by 1.
            newOpnd = IR::AddrOpnd::NewFromNumber(-(int64)value, m_func);
        }

        instrNeg->ClearBailOutInfo();
        instrNeg->FreeSrc1();
        instrNeg->SetSrc1(newOpnd);
        instrNeg = this->ChangeToAssign(instrNeg);

        // Skip lowering call to helper
        return false;
    }

    bool isInt = (opndSrc1->IsTaggedInt());

    if (opndSrc1->IsRegOpnd() && opndSrc1->AsRegOpnd()->IsNotInt())
    {
        return true;
    }

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    if (!isInt)
    {
        GenerateSmIntTest(opndSrc1, instrNeg, labelHelper);
    }

    //
    // For 32 bit arithmetic we copy them and set the size of operands to be 32 bits. This is
    // relevant only on AMD64.
    //
    opndSrc1    = opndSrc1->UseWithNewType(TyInt32, this->m_func);
    GenerateTaggedZeroTest(opndSrc1, instrNeg, labelHelper);

    // dst = MOV src

    instr = IR::Instr::New(Js::OpCode::MOV, opndDst, opndSrc1, this->m_func);
    instrNeg->InsertBefore(instr);

    // dst = NEG dst

    instr = IR::Instr::New(Js::OpCode::NEG, opndDst, opndDst, this->m_func);
    instrNeg->InsertBefore(instr);

#if !INT32VAR
    // dst = ADD dst, 2

    instr = IR::Instr::New(Js::OpCode::ADD, opndDst, opndDst, IR::IntConstOpnd::New(2, TyInt32, this->m_func), this->m_func);
    instrNeg->InsertBefore(instr);
#endif

    // JO $helper

    instr = IR::BranchInstr::New(Js::OpCode::JO, labelHelper, this->m_func);
    instrNeg->InsertBefore(instr);

    //
    // Convert TyInt32 operand, back to TyMachPtr type.
    //
    if(TyMachReg != opndDst->GetType())
    {
        opndDst = opndDst->UseWithNewType(TyMachPtr, this->m_func);
    }

#if INT32VAR
    GenerateInt32ToVarConversion(opndDst, instrNeg);
#endif
    if(usingNewDst)
    {
        instr = IR::Instr::New(Js::OpCode::MOV, instrNeg->GetDst(), opndDst, this->m_func);
        instrNeg->InsertBefore(instr);
    }

    // JMP $fallthru

    labelFallThru = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(Js::OpCode::JMP, labelFallThru, this->m_func);
    instrNeg->InsertBefore(instr);

    // $helper:
    //      (caller generates helper sequence)
    // $fallthru:

    AssertMsg(labelHelper, "Should not be NULL");
    instrNeg->InsertBefore(labelHelper);
    instrNeg->InsertAfter(labelFallThru);

    return true;
}